

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__process_marker(stbi__jpeg *z,int m)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  sbyte sVar4;
  stbi_uc sVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int sizes [16];
  int iVar9;
  
  if (m == 0xc4) {
    iVar8 = stbi__get16be(z->s);
    for (iVar8 = iVar8 + -2; 0 < iVar8; iVar8 = (iVar8 + -0x11) - (int)uVar12) {
      bVar6 = stbi__get8(z->s);
      if (0x1f < bVar6) {
        return 0;
      }
      bVar2 = bVar6 & 0xf;
      if (3 < bVar2) {
        return 0;
      }
      uVar12 = 0;
      for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
        bVar3 = stbi__get8(z->s);
        sizes[lVar13] = (uint)bVar3;
        uVar12 = (ulong)((int)uVar12 + (uint)bVar3);
      }
      if (bVar6 < 0x10) {
        iVar9 = stbi__build_huffman(z->huff_dc + bVar2,sizes);
        lVar13 = 8;
      }
      else {
        iVar9 = stbi__build_huffman(z->huff_ac + bVar2,sizes);
        lVar13 = 0x1a48;
      }
      if (iVar9 == 0) {
        return 0;
      }
      for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
        sVar5 = stbi__get8(z->s);
        z->huff_dc[bVar2].values[uVar14 + lVar13 + -8] = sVar5;
      }
      if (0xf < bVar6) {
        for (lVar13 = 0; lVar13 != 0x200; lVar13 = lVar13 + 1) {
          uVar14 = (ulong)z->huff_ac[bVar2].fast[lVar13];
          z->fast_ac[bVar2][lVar13] = 0;
          if (uVar14 != 0xff) {
            bVar6 = z->huff_ac[bVar2].values[uVar14];
            if ((bVar6 & 0xf) != 0) {
              bVar3 = z->huff_ac[bVar2].size[uVar14];
              uVar7 = (bVar6 & 0xf) + (ushort)bVar3;
              if (uVar7 < 10) {
                uVar11 = (int)lVar13 << (bVar3 & 0x1f) & 0x1ff;
                sVar4 = (sbyte)(bVar6 & 0xf);
                uVar10 = -1 << sVar4 | 1;
                if (0xff < uVar11) {
                  uVar10 = 0;
                }
                iVar9 = uVar10 + (uVar11 >> (9U - sVar4 & 0x1f));
                if ((char)iVar9 == iVar9) {
                  z->fast_ac[bVar2][lVar13] = (short)iVar9 * 0x100 | bVar6 & 0xfff0 | uVar7;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (m != 0xdb) {
      if (m == 0xff) {
        return 0;
      }
      if (m == 0xdd) {
        iVar8 = stbi__get16be(z->s);
        if (iVar8 == 4) {
          iVar8 = stbi__get16be(z->s);
          z->restart_interval = iVar8;
          return 1;
        }
      }
      else if ((m == 0xfe || (m & 0xfffffff0U) == 0xe0) &&
              (uVar10 = stbi__get16be(z->s), 1 < uVar10)) {
        if (uVar10 < 7 || m != 0xe0) {
          if (uVar10 < 0xe || m != 0xee) {
            iVar8 = uVar10 - 2;
          }
          else {
            bVar1 = true;
            for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
              sVar5 = stbi__get8(z->s);
              if (sVar5 != "Adobe"[lVar13]) {
                bVar1 = false;
              }
            }
            if (bVar1) {
              stbi__get8(z->s);
              stbi__get16be(z->s);
              stbi__get16be(z->s);
              bVar6 = stbi__get8(z->s);
              z->app14_color_transform = (uint)bVar6;
              iVar8 = uVar10 - 0xe;
            }
            else {
              iVar8 = uVar10 - 8;
            }
          }
        }
        else {
          bVar1 = true;
          for (lVar13 = 0; lVar13 != 5; lVar13 = lVar13 + 1) {
            sVar5 = stbi__get8(z->s);
            if (sVar5 != "JFIF"[lVar13]) {
              bVar1 = false;
            }
          }
          iVar8 = uVar10 - 7;
          if (bVar1) {
            z->jfif = 1;
          }
        }
        stbi__skip(z->s,iVar8);
        return 1;
      }
      return 0;
    }
    iVar8 = stbi__get16be(z->s);
    for (iVar8 = iVar8 + -2; 0 < iVar8; iVar8 = iVar8 + (uint)(bVar6 < 0x10) * 0x40 + -0x81) {
      bVar6 = stbi__get8(z->s);
      if (0xf < bVar6 && (bVar6 & 0xfffffff0) != 0x10) {
        return 0;
      }
      uVar10 = bVar6 & 0xf;
      if (3 < uVar10) {
        return 0;
      }
      for (lVar13 = 0; lVar13 != 0x40; lVar13 = lVar13 + 1) {
        if (bVar6 < 0x10) {
          bVar2 = stbi__get8(z->s);
          uVar7 = (ushort)bVar2;
        }
        else {
          iVar9 = stbi__get16be(z->s);
          uVar7 = (ushort)iVar9;
        }
        *(ushort *)((long)z->dequant[0] + (ulong)""[lVar13] * 2 + (ulong)(uVar10 << 7)) = uVar7;
      }
    }
  }
  return (uint)(iVar8 == 0);
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}